

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall ft::deque<int,_ft::allocator<int>_>::~deque(deque<int,_ft::allocator<int>_> *this)

{
  pointer p;
  bool bVar1;
  size_type sVar2;
  ulong local_48;
  size_type i;
  iterator it;
  chunk_allocator chunk_alloc;
  deque<int,_ft::allocator<int>_> *this_local;
  
  allocator<int_*>::allocator((allocator<int_*> *)((long)&it.m_node + 7));
  dequeIterator<int,_64UL>::dequeIterator((dequeIterator<int,_64UL> *)&i,&this->m_start);
  while( true ) {
    bVar1 = operator!=((dequeIterator<int,_64UL> *)&i,&this->m_finish);
    if (!bVar1) break;
    allocator<int>::destroy((allocator<int> *)&this->field_0x70,(pointer)it._vptr_dequeIterator);
    dequeIterator<int,_64UL>::operator++((dequeIterator<int,_64UL> *)&i);
  }
  dequeIterator<int,_64UL>::~dequeIterator((dequeIterator<int,_64UL> *)&i);
  for (local_48 = 0; local_48 < this->m_map_size; local_48 = local_48 + 1) {
    allocator<int_*>::destroy((allocator<int_*> *)((long)&it.m_node + 7),this->m_map + local_48);
    p = this->m_map[local_48];
    sVar2 = chunk_size(this);
    allocator<int>::deallocate((allocator<int> *)&this->field_0x70,p,sVar2);
  }
  allocator<int_*>::deallocate
            ((allocator<int_*> *)((long)&it.m_node + 7),this->m_map,this->m_map_size);
  allocator<int_*>::~allocator((allocator<int_*> *)((long)&it.m_node + 7));
  allocator<int>::~allocator((allocator<int> *)&this->field_0x70);
  dequeIterator<int,_64UL>::~dequeIterator(&this->m_finish);
  dequeIterator<int,_64UL>::~dequeIterator(&this->m_start);
  return;
}

Assistant:

~deque() {
		chunk_allocator	chunk_alloc;

		for (iterator it = this->m_start; it != this->m_finish; ++it) {
			this->m_alloc.destroy(it.m_cur);
		}
		for (size_type i = 0; i < this->m_map_size; ++i) {
			chunk_alloc.destroy(this->m_map + i);
			this->m_alloc.deallocate(this->m_map[i], this->chunk_size());
		}
		chunk_alloc.deallocate(this->m_map, this->m_map_size);
	}